

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O1

void TxToUniv(CTransaction *tx,uint256 *block_hash,UniValue *entry,bool include_hex,CTxUndo *txundo,
             TxVerbosity verbosity)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CScript *pCVar3;
  pointer pCVar4;
  pointer pvVar5;
  uchar *puVar6;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  string key_10;
  string key_11;
  string key_12;
  string key_13;
  string key_14;
  string key_15;
  string key_16;
  string key_17;
  string key_18;
  string key_19;
  string key_20;
  string key_21;
  string key_22;
  string key_23;
  string key_24;
  string key_25;
  string key_26;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  UniValue val_10;
  UniValue val_11;
  UniValue val_12;
  UniValue val_13;
  UniValue val_14;
  UniValue val_15;
  UniValue val_16;
  UniValue val_17;
  UniValue val_18;
  UniValue val_19;
  UniValue val_20;
  UniValue val_21;
  UniValue val_22;
  UniValue val_23;
  UniValue val_24;
  UniValue val_25;
  UniValue val_26;
  UniValue val_27;
  UniValue val_28;
  UniValue val_29;
  bool bVar7;
  VType VVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint256 *puVar12;
  undefined7 in_register_00000009;
  int iVar13;
  uint uVar14;
  pointer pCVar15;
  uint uVar16;
  pointer pvVar17;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  pointer pCVar20;
  undefined4 uVar21;
  pointer pCVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  CTxUndo *pCVar25;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  undefined8 in_stack_ffffffffffffeed8;
  UniValue *this;
  UniValue *pUVar26;
  ulong in_stack_ffffffffffffeee0;
  undefined8 in_stack_ffffffffffffeee8;
  CTransaction *tx_00;
  CTransaction *pCVar27;
  undefined8 in_stack_ffffffffffffeef0;
  long lVar28;
  long lVar29;
  undefined4 in_stack_ffffffffffffef00;
  uint256 *puVar30;
  ulong in_stack_ffffffffffffef10;
  bool in_stack_ffffffffffffef18;
  uint7 in_stack_ffffffffffffef19;
  undefined8 in_stack_ffffffffffffef20;
  _Alloc_hider in_stack_ffffffffffffef28;
  size_type in_stack_ffffffffffffef30;
  undefined8 in_stack_ffffffffffffef38;
  undefined1 in_stack_ffffffffffffef40 [16];
  vector<UniValue,_std::allocator<UniValue>_> local_10a0;
  pointer local_1088 [2];
  pointer local_1078 [2];
  UniValue local_1068;
  long *local_1010 [2];
  long local_1000 [2];
  UniValue local_ff0;
  long *local_f98 [2];
  long local_f88 [2];
  VType local_f78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f70;
  size_type local_f68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f50;
  vector<UniValue,_std::allocator<UniValue>_> local_f38;
  long *local_f20 [2];
  long local_f10 [2];
  VType local_f00;
  size_type *local_ef8;
  size_type local_ef0;
  size_type local_ee8;
  undefined8 uStack_ee0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ed8;
  vector<UniValue,_std::allocator<UniValue>_> local_ec0;
  VType local_ea8;
  size_type *local_ea0;
  size_type local_e98;
  size_type local_e90;
  undefined8 uStack_e88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e80;
  vector<UniValue,_std::allocator<UniValue>_> local_e68;
  long *local_e50 [2];
  long local_e40 [2];
  undefined1 *local_e30;
  undefined8 local_e28;
  undefined1 local_e20;
  uint7 uStack_e1f;
  undefined8 uStack_e18;
  UniValue local_e10;
  long *local_db8 [2];
  long local_da8 [2];
  UniValue local_d98;
  long *local_d40 [2];
  long local_d30 [2];
  undefined1 *local_d20;
  undefined8 local_d18;
  undefined1 local_d10;
  uint7 uStack_d0f;
  undefined8 uStack_d08;
  undefined1 *local_d00;
  undefined8 local_cf8;
  undefined1 local_cf0 [9];
  undefined4 local_ce7;
  undefined2 local_ce3;
  char local_ce1;
  VType local_ce0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_cd8;
  size_type local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cb8;
  vector<UniValue,_std::allocator<UniValue>_> local_ca0;
  long *local_c88 [2];
  long local_c78 [2];
  VType local_c68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c60;
  size_type local_c58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c40;
  vector<UniValue,_std::allocator<UniValue>_> local_c28;
  UniValue local_c10;
  long *local_bb8 [2];
  long local_ba8 [2];
  VType local_b98;
  size_type *local_b90;
  size_type local_b88;
  size_type local_b80;
  undefined8 uStack_b78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b70;
  vector<UniValue,_std::allocator<UniValue>_> local_b58;
  long *local_b40 [2];
  long local_b30 [2];
  VType local_b20;
  size_type *local_b18;
  size_type local_b10;
  size_type local_b08;
  undefined8 uStack_b00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_af8;
  vector<UniValue,_std::allocator<UniValue>_> local_ae0;
  long *local_ac8 [2];
  long local_ab8 [2];
  UniValue local_aa8;
  long *local_a50 [2];
  long local_a40 [2];
  UniValue local_a30;
  long *local_9d8 [2];
  long local_9c8 [2];
  UniValue local_9b8;
  long *local_960 [2];
  long local_950 [2];
  undefined1 *local_940;
  undefined8 local_938;
  undefined1 local_930;
  uint7 uStack_92f;
  undefined8 uStack_928;
  UniValue p;
  uint7 uStack_8b7;
  undefined8 uStack_8b0;
  size_type *local_8a0;
  size_type local_890;
  undefined8 uStack_888;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  vector<UniValue,_std::allocator<UniValue>_> local_868;
  long *local_850 [2];
  long local_840 [2];
  UniValue local_830;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined1 local_7c8;
  uint7 uStack_7c7;
  undefined8 uStack_7c0;
  VType local_7b8;
  size_type *local_7b0;
  size_type local_7a8;
  size_type local_7a0;
  undefined8 uStack_798;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_790;
  vector<UniValue,_std::allocator<UniValue>_> local_778;
  long *local_760 [2];
  long local_750 [2];
  UniValue local_740;
  long *local_6e8 [2];
  long local_6d8 [2];
  UniValue local_6c8;
  long *local_670 [2];
  long local_660 [2];
  undefined1 *local_650;
  undefined8 local_648;
  undefined1 local_640;
  uint7 uStack_63f;
  undefined8 uStack_638;
  UniValue o;
  UniValue local_5d8;
  long *local_580 [2];
  long local_570 [2];
  UniValue local_560;
  long *local_508 [2];
  long local_4f8 [2];
  UniValue local_4e8;
  size_type *local_490 [2];
  size_type local_480 [2];
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  UniValue vout;
  undefined8 local_3e7;
  undefined4 local_3df;
  undefined2 local_3db;
  char local_3d9;
  UniValue vin;
  UniValue local_380;
  long *local_328 [2];
  long local_318 [2];
  UniValue local_308;
  long *local_2b0 [2];
  long local_2a0 [2];
  UniValue local_290;
  long *local_238 [2];
  long local_228 [2];
  UniValue local_218;
  long *local_1c0 [2];
  long local_1b0 [2];
  UniValue local_1a0;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  UniValue local_b0;
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_1068.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  vin.typ._0_1_ = 0 < (int)verbosity;
  inline_check_non_fatal<bool>
            ((bool *)&vin,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/core_write.cpp"
             ,0xad,"TxToUniv","verbosity >= TxVerbosity::SHOW_DETAILS");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"txid","");
  base_blob<256u>::GetHex_abi_cxx11_((string *)&vin,&tx->hash);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vin);
  key._M_string_length = in_stack_ffffffffffffeee0;
  key._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeed8;
  key.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_02.val._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef00;
  val_02._0_8_ = txundo;
  val_02.val._M_dataplus._M_p._4_4_ = verbosity;
  val_02.val._M_string_length = (size_type)block_hash;
  val_02.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_02.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_02.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,local_b0.val.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &vin.val._M_string_length;
  if ((size_type *)vin._0_8_ != psVar1) {
    operator_delete((void *)vin._0_8_,vin.val._M_string_length + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"hash","");
  base_blob<256u>::GetHex_abi_cxx11_((string *)&vin,&tx->m_witness_hash);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vin);
  key_00._M_string_length = in_stack_ffffffffffffeee0;
  key_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeed8;
  key_00.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_00.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_03.val._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef00;
  val_03._0_8_ = txundo;
  val_03.val._M_dataplus._M_p._4_4_ = verbosity;
  val_03.val._M_string_length = (size_type)block_hash;
  val_03.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_03.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_03.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key_00,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)vin._0_8_ != psVar1) {
    operator_delete((void *)vin._0_8_,vin.val._M_string_length + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"version","");
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(&local_1a0,&tx->version);
  key_01._M_string_length = in_stack_ffffffffffffeee0;
  key_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeed8;
  key_01.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_01.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_04.val._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef00;
  val_04._0_8_ = txundo;
  val_04.val._M_dataplus._M_p._4_4_ = verbosity;
  val_04.val._M_string_length = (size_type)block_hash;
  val_04.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_04.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_04.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key_01,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.val._M_dataplus._M_p != &local_1a0.val.field_2) {
    operator_delete(local_1a0.val._M_dataplus._M_p,local_1a0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"size","");
  VVar8 = CTransaction::GetTotalSize(tx);
  vin.typ = VVar8;
  UniValue::UniValue<unsigned_int,_unsigned_int,_true>(&local_218,&vin.typ);
  key_02._M_string_length = in_stack_ffffffffffffeee0;
  key_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeed8;
  key_02.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_02.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_05.val._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffef00;
  val_05._0_8_ = txundo;
  val_05.val._M_dataplus._M_p._4_4_ = verbosity;
  val_05.val._M_string_length = (size_type)block_hash;
  val_05.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_05.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_05.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key_02,val_05);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_218.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.val._M_dataplus._M_p != &local_218.val.field_2) {
    operator_delete(local_218.val._M_dataplus._M_p,local_218.val.field_2._M_allocated_capacity + 1);
  }
  uVar21 = (undefined4)CONCAT71(in_register_00000009,include_hex);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"vsize","");
  vout.typ = VNULL;
  vout._4_4_ = 0;
  vin._0_8_ = &TX_NO_WITNESS;
  vin.val._M_dataplus._M_p = (pointer)&vout;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&vin,&TX_NO_WITNESS);
  uVar18 = vout._0_8_;
  vout.typ = VNULL;
  vout._4_4_ = 0;
  vin._0_8_ = &TX_WITH_WITNESS;
  vin.val._M_dataplus._M_p = (pointer)&vout;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&vin,&TX_WITH_WITNESS);
  iVar9 = (VType)uVar18 * 3;
  iVar13 = vout.typ + iVar9 + 3;
  iVar9 = iVar9 + vout.typ + 6;
  if (-1 < iVar13) {
    iVar9 = iVar13;
  }
  o.typ = iVar9 >> 2;
  UniValue::UniValue<int,_int,_true>(&local_290,(int *)&o);
  key_03._M_string_length = in_stack_ffffffffffffeee0;
  key_03._M_dataplus._M_p = (pointer)entry;
  key_03.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_03.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_06.val._M_dataplus._M_p._0_4_ = uVar21;
  val_06._0_8_ = txundo;
  val_06.val._M_dataplus._M_p._4_4_ = verbosity;
  val_06.val._M_string_length = (size_type)block_hash;
  val_06.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_06.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_06.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key_03,val_06);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_290.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.val._M_dataplus._M_p != &local_290.val.field_2) {
    operator_delete(local_290.val._M_dataplus._M_p,local_290.val.field_2._M_allocated_capacity + 1);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"weight","");
  vout.typ = VNULL;
  vout._4_4_ = 0;
  vin._0_8_ = &TX_NO_WITNESS;
  vin.val._M_dataplus._M_p = (pointer)&vout;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&vin,&TX_NO_WITNESS);
  uVar18 = vout._0_8_;
  vout.typ = VNULL;
  vout._4_4_ = 0;
  vin._0_8_ = &TX_WITH_WITNESS;
  vin.val._M_dataplus._M_p = (pointer)&vout;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&vin,&TX_WITH_WITNESS);
  o.typ = (VType)uVar18 * 3 + vout.typ;
  UniValue::UniValue<int,_int,_true>(&local_308,(int *)&o);
  key_04._M_string_length = in_stack_ffffffffffffeee0;
  key_04._M_dataplus._M_p = (pointer)entry;
  key_04.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_04.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_07.val._M_dataplus._M_p._0_4_ = uVar21;
  val_07._0_8_ = txundo;
  val_07.val._M_dataplus._M_p._4_4_ = verbosity;
  val_07.val._M_string_length = (size_type)block_hash;
  val_07.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_07.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_07.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  this = entry;
  UniValue::pushKV(entry,key_04,val_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_308.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308.val._M_dataplus._M_p != &local_308.val.field_2) {
    operator_delete(local_308.val._M_dataplus._M_p,local_308.val.field_2._M_allocated_capacity + 1);
  }
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"locktime","");
  vin._0_8_ = ZEXT48(tx->nLockTime);
  UniValue::UniValue<long,_long,_true>(&local_380,(long *)&vin);
  key_05._M_string_length = in_stack_ffffffffffffeee0;
  key_05._M_dataplus._M_p = (pointer)this;
  key_05.field_2._M_allocated_capacity = in_stack_ffffffffffffeee8;
  key_05.field_2._8_8_ = in_stack_ffffffffffffeef0;
  val_08.val._M_dataplus._M_p._0_4_ = uVar21;
  val_08._0_8_ = txundo;
  val_08.val._M_dataplus._M_p._4_4_ = verbosity;
  val_08.val._M_string_length = (size_type)block_hash;
  val_08.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_08.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_08.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  UniValue::pushKV(entry,key_05,val_08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_380.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_380.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.val._M_dataplus._M_p != &local_380.val.field_2) {
    operator_delete(local_380.val._M_dataplus._M_p,local_380.val.field_2._M_allocated_capacity + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  vin.val._M_dataplus._M_p = (pointer)&vin.val.field_2;
  vin.typ = VARR;
  vin.val.field_2._M_local_buf[0] = '\0';
  vin.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_3e7;
  vin.val.field_2._M_local_buf[8] = (char)((ulong)local_3e7 >> 0x38);
  vin.val.field_2._9_4_ = local_3df;
  vin.val.field_2._13_2_ = local_3db;
  vin.val.field_2._M_local_buf[0xf] = local_3d9;
  vin.val._M_string_length = 0;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  pCVar15 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar28 = 0;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar15) {
    in_stack_ffffffffffffeee0 = 0;
    lVar28 = 0;
    do {
      vout.val._M_dataplus._M_p = (pointer)&vout.val.field_2;
      local_470 = &local_460;
      vout.typ = VOBJ;
      vout.val.field_2._M_local_buf[0] = '\0';
      vout.val.field_2._M_allocated_capacity._1_7_ = uStack_45f;
      vout.val.field_2._M_local_buf[8] = (char)uStack_458;
      vout.val.field_2._9_4_ = (undefined4)((ulong)uStack_458 >> 8);
      vout.val.field_2._13_2_ = (undefined2)((ulong)uStack_458 >> 0x28);
      vout.val.field_2._M_local_buf[0xf] = (char)((ulong)uStack_458 >> 0x38);
      vout.val._M_string_length = 0;
      local_468 = 0;
      local_460 = 0;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar10 = in_stack_ffffffffffffeee0;
      bVar7 = CTransaction::IsCoinBase(tx);
      pCVar15 = pCVar15 + in_stack_ffffffffffffeee0;
      uVar24 = in_stack_ffffffffffffeee0;
      if (bVar7) {
        local_490[0] = local_480;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"coinbase","");
        uVar16 = (pCVar15->scriptSig).super_CScriptBase._size;
        uVar14 = uVar16 - 0x1d;
        pCVar3 = (CScript *)(pCVar15->scriptSig).super_CScriptBase._union.indirect_contents.indirect
        ;
        if (uVar16 < 0x1d) {
          uVar14 = uVar16;
          pCVar3 = &pCVar15->scriptSig;
        }
        s.m_size._0_4_ = uVar14;
        s.m_data = (uchar *)pCVar3;
        s.m_size._4_4_ = 0;
        HexStr_abi_cxx11_((string *)&o,s);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_4e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        key_06._M_string_length = uVar24;
        key_06._M_dataplus._M_p = (pointer)this;
        key_06.field_2._M_allocated_capacity = (size_type)tx;
        key_06.field_2._8_8_ = lVar28;
        val_09.val._M_dataplus._M_p._0_4_ = uVar21;
        val_09._0_8_ = txundo;
        val_09.val._M_dataplus._M_p._4_4_ = verbosity;
        val_09.val._M_string_length = (size_type)block_hash;
        val_09.val.field_2._M_allocated_capacity = uVar10;
        val_09.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_09.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_09.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        UniValue::pushKV(&vout,key_06,val_09);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4e8.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_4e8.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8.val._M_dataplus._M_p != &local_4e8.val.field_2) {
          operator_delete(local_4e8.val._M_dataplus._M_p,
                          local_4e8.val.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)o._0_8_ != &o.val._M_string_length) {
          operator_delete((void *)o._0_8_,o.val._M_string_length + 1);
        }
        uVar18 = local_480[0];
        _Var19._M_p = (pointer)local_490[0];
        if (local_490[0] != local_480) {
LAB_00d54fe5:
          operator_delete(_Var19._M_p,uVar18 + 1);
        }
      }
      else {
        local_508[0] = local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"txid","");
        base_blob<256u>::GetHex_abi_cxx11_((string *)&o,pCVar15);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_560,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
        key_07._M_string_length = uVar24;
        key_07._M_dataplus._M_p = (pointer)this;
        key_07.field_2._M_allocated_capacity = (size_type)tx;
        key_07.field_2._8_8_ = lVar28;
        val_10.val._M_dataplus._M_p._0_4_ = uVar21;
        val_10._0_8_ = txundo;
        val_10.val._M_dataplus._M_p._4_4_ = verbosity;
        val_10.val._M_string_length = (size_type)block_hash;
        val_10.val.field_2._M_allocated_capacity = uVar10;
        val_10.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_10.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_10.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_10.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        UniValue::pushKV(&vout,key_07,val_10);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_560.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560.val._M_dataplus._M_p != &local_560.val.field_2) {
          operator_delete(local_560.val._M_dataplus._M_p,
                          local_560.val.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)o._0_8_ != &o.val._M_string_length) {
          operator_delete((void *)o._0_8_,o.val._M_string_length + 1);
        }
        if (local_508[0] != local_4f8) {
          operator_delete(local_508[0],local_4f8[0] + 1);
        }
        local_580[0] = local_570;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"vout","");
        o._0_8_ = ZEXT48((pCVar15->prevout).n);
        UniValue::UniValue<long,_long,_true>(&local_5d8,(long *)&o);
        key_08._M_string_length = uVar24;
        key_08._M_dataplus._M_p = (pointer)this;
        key_08.field_2._M_allocated_capacity = (size_type)tx;
        key_08.field_2._8_8_ = lVar28;
        val_11.val._M_dataplus._M_p._0_4_ = uVar21;
        val_11._0_8_ = txundo;
        val_11.val._M_dataplus._M_p._4_4_ = verbosity;
        val_11.val._M_string_length = (size_type)block_hash;
        val_11.val.field_2._M_allocated_capacity = uVar10;
        val_11.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_11.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_11.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_11.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        UniValue::pushKV(&vout,key_08,val_11);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5d8.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_5d8.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8.val._M_dataplus._M_p != &local_5d8.val.field_2) {
          operator_delete(local_5d8.val._M_dataplus._M_p,
                          local_5d8.val.field_2._M_allocated_capacity + 1);
        }
        if (local_580[0] != local_570) {
          operator_delete(local_580[0],local_570[0] + 1);
        }
        local_650 = &local_640;
        o.typ = VOBJ;
        o.val._M_dataplus._M_p = (pointer)&o.val.field_2;
        o.val.field_2._M_allocated_capacity = (ulong)uStack_63f << 8;
        o.val.field_2._8_8_ = uStack_638;
        o.val._M_string_length = 0;
        local_648 = 0;
        local_640 = 0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_670[0] = local_660;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_670,"asm","");
        ScriptToAsmStr_abi_cxx11_((string *)&p,&pCVar15->scriptSig,true);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_6c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
        key_09._M_string_length = uVar24;
        key_09._M_dataplus._M_p = (pointer)this;
        key_09.field_2._M_allocated_capacity = (size_type)tx;
        key_09.field_2._8_8_ = lVar28;
        val_12.val._M_dataplus._M_p._0_4_ = uVar21;
        val_12._0_8_ = txundo;
        val_12.val._M_dataplus._M_p._4_4_ = verbosity;
        val_12.val._M_string_length = (size_type)block_hash;
        val_12.val.field_2._M_allocated_capacity = uVar10;
        val_12.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_12.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_12.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_12.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        UniValue::pushKV(&o,key_09,val_12);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_6c8.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_6c8.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8.val._M_dataplus._M_p != &local_6c8.val.field_2) {
          operator_delete(local_6c8.val._M_dataplus._M_p,
                          local_6c8.val.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)p._0_8_ != &p.val._M_string_length) {
          operator_delete((void *)p._0_8_,p.val._M_string_length + 1);
        }
        if (local_670[0] != local_660) {
          operator_delete(local_670[0],local_660[0] + 1);
        }
        local_6e8[0] = local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"hex","");
        uVar16 = (pCVar15->scriptSig).super_CScriptBase._size;
        uVar14 = uVar16 - 0x1d;
        pCVar3 = (CScript *)(pCVar15->scriptSig).super_CScriptBase._union.indirect_contents.indirect
        ;
        if (uVar16 < 0x1d) {
          uVar14 = uVar16;
          pCVar3 = &pCVar15->scriptSig;
        }
        s_00.m_size._0_4_ = uVar14;
        s_00.m_data = (uchar *)pCVar3;
        s_00.m_size._4_4_ = 0;
        HexStr_abi_cxx11_((string *)&p,s_00);
        UniValue::
        UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_740,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
        key_10._M_string_length = uVar24;
        key_10._M_dataplus._M_p = (pointer)this;
        key_10.field_2._M_allocated_capacity = (size_type)tx;
        key_10.field_2._8_8_ = lVar28;
        val_13.val._M_dataplus._M_p._0_4_ = uVar21;
        val_13._0_8_ = txundo;
        val_13.val._M_dataplus._M_p._4_4_ = verbosity;
        val_13.val._M_string_length = (size_type)block_hash;
        val_13.val.field_2._M_allocated_capacity = uVar10;
        val_13.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_13.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_13.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_13.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        UniValue::pushKV(&o,key_10,val_13);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_740.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_740.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740.val._M_dataplus._M_p != &local_740.val.field_2) {
          operator_delete(local_740.val._M_dataplus._M_p,
                          local_740.val.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)p._0_8_ != &p.val._M_string_length) {
          operator_delete((void *)p._0_8_,p.val._M_string_length + 1);
        }
        if (local_6e8[0] != local_6d8) {
          operator_delete(local_6e8[0],local_6d8[0] + 1);
        }
        local_760[0] = local_750;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"scriptSig","");
        local_7b8 = o.typ;
        local_7b0 = &local_7a0;
        paVar23 = &o.val.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)o.val._M_dataplus._M_p == paVar23) {
          uStack_798 = o.val.field_2._8_8_;
        }
        else {
          local_7b0 = (size_type *)o.val._M_dataplus._M_p;
        }
        local_7a0 = o.val.field_2._M_allocated_capacity;
        local_7a8 = o.val._M_string_length;
        o.val._M_string_length = 0;
        o.val.field_2._M_allocated_capacity =
             o.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_790.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_790.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_790.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_778.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_778.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_778.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key_11._M_string_length = uVar24;
        key_11._M_dataplus._M_p = (pointer)this;
        key_11.field_2._M_allocated_capacity = (size_type)tx;
        key_11.field_2._8_8_ = lVar28;
        val_14.val._M_dataplus._M_p._0_4_ = uVar21;
        val_14._0_8_ = txundo;
        val_14.val._M_dataplus._M_p._4_4_ = verbosity;
        val_14.val._M_string_length = (size_type)block_hash;
        val_14.val.field_2._M_allocated_capacity = uVar10;
        val_14.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_14.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_14.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_14.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_14.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_14.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        o.val._M_dataplus._M_p = (pointer)paVar23;
        UniValue::pushKV(&vout,key_11,val_14);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_778);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_790);
        if (local_7b0 != &local_7a0) {
          operator_delete(local_7b0,local_7a0 + 1);
        }
        if (local_760[0] != local_750) {
          operator_delete(local_760[0],local_750[0] + 1);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&o.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&o.keys);
        uVar18 = o.val.field_2._M_allocated_capacity;
        _Var19 = o.val._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)o.val._M_dataplus._M_p != &o.val.field_2) goto LAB_00d54fe5;
      }
      pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)&pCVar4[in_stack_ffffffffffffeee0].scriptWitness.stack !=
          *(pointer *)((long)&pCVar4[in_stack_ffffffffffffeee0].scriptWitness.stack + 8)) {
        local_7d8 = &local_7c8;
        o.typ = VARR;
        o.val._M_dataplus._M_p = (pointer)&o.val.field_2;
        o.val.field_2._M_allocated_capacity = (ulong)uStack_7c7 << 8;
        o.val.field_2._8_8_ = uStack_7c0;
        o.val._M_string_length = 0;
        local_7d0 = 0;
        local_7c8 = 0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar5 = *(pointer *)((long)&pCVar4[in_stack_ffffffffffffeee0].scriptWitness.stack + 8);
        for (pvVar17 = *(pointer *)&pCVar4[in_stack_ffffffffffffeee0].scriptWitness.stack;
            pvVar17 != pvVar5; pvVar17 = pvVar17 + 1) {
          puVar6 = *(uchar **)
                    &(pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl;
          s_01.m_size = (long)*(pointer *)
                               ((long)&(pvVar17->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl + 8) - (long)puVar6;
          s_01.m_data = puVar6;
          HexStr_abi_cxx11_((string *)&p,s_01);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_830,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
          val.val._M_dataplus._M_p = (pointer)uVar24;
          val._0_8_ = this;
          val.val._M_string_length = (size_type)tx;
          val.val.field_2._M_allocated_capacity = lVar28;
          val.val.field_2._8_8_ = txundo;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar21;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = verbosity;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)block_hash;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar10;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffef18;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffef19;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef20;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef28._M_p;
          UniValue::push_back(&o,val);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_830.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_830.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_830.val._M_dataplus._M_p != &local_830.val.field_2) {
            operator_delete(local_830.val._M_dataplus._M_p,
                            local_830.val.field_2._M_allocated_capacity + 1);
          }
          if ((size_type *)p._0_8_ != &p.val._M_string_length) {
            operator_delete((void *)p._0_8_,p.val._M_string_length + 1);
          }
        }
        local_850[0] = local_840;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"txinwitness","");
        local_8a0 = &local_890;
        paVar23 = &o.val.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)o.val._M_dataplus._M_p == paVar23) {
          uStack_888 = o.val.field_2._8_8_;
        }
        else {
          local_8a0 = (size_type *)o.val._M_dataplus._M_p;
        }
        local_890 = o.val.field_2._M_allocated_capacity;
        o.val._M_string_length = 0;
        o.val.field_2._M_allocated_capacity =
             o.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_880.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_880.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_880.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             o.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        o.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_868.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key_12._M_string_length = uVar24;
        key_12._M_dataplus._M_p = (pointer)this;
        key_12.field_2._M_allocated_capacity = (size_type)tx;
        key_12.field_2._8_8_ = lVar28;
        val_15.val._M_dataplus._M_p._0_4_ = uVar21;
        val_15._0_8_ = txundo;
        val_15.val._M_dataplus._M_p._4_4_ = verbosity;
        val_15.val._M_string_length = (size_type)block_hash;
        val_15.val.field_2._M_allocated_capacity = uVar10;
        val_15.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
        val_15.val.field_2._9_7_ = in_stack_ffffffffffffef19;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
        val_15.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
        val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
        val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
        val_15.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
        o.val._M_dataplus._M_p = (pointer)paVar23;
        UniValue::pushKV(&vout,key_12,val_15);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_868);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_880);
        if (local_8a0 != &local_890) {
          operator_delete(local_8a0,local_890 + 1);
        }
        if (local_850[0] != local_840) {
          operator_delete(local_850[0],local_840[0] + 1);
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&o.values);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&o.keys);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)o.val._M_dataplus._M_p != paVar23) {
          operator_delete(o.val._M_dataplus._M_p,o.val.field_2._M_allocated_capacity + 1);
        }
      }
      if (txundo != (CTxUndo *)0x0) {
        pCVar22 = (txundo->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar28 = lVar28 + pCVar22[uVar24].out.nValue;
        if (verbosity == SHOW_DETAILS_AND_PREVOUT) {
          pCVar22 = pCVar22 + uVar24;
          o.typ = VOBJ;
          o.val._M_dataplus._M_p = (pointer)&o.val.field_2;
          o.val.field_2._M_allocated_capacity = (ulong)uStack_8b7 << 8;
          o.val.field_2._8_8_ = uStack_8b0;
          o.val._M_string_length = 0;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ScriptToUniv(&(pCVar22->out).scriptPubKey,&o,true,true,(SigningProvider *)0x0);
          local_940 = &local_930;
          p.typ = VOBJ;
          p.val._M_dataplus._M_p = (pointer)&p.val.field_2;
          p.val.field_2._M_allocated_capacity = (ulong)uStack_92f << 8;
          p.val.field_2._8_8_ = uStack_928;
          p.val._M_string_length = 0;
          local_938 = 0;
          local_930 = 0;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_960[0] = local_950;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_960,"generated","");
          bVar7 = (bool)(pCVar22->field_0x28 & 1);
          UniValue::UniValue<bool,_bool,_true>(&local_9b8,(bool *)&stack0xffffffffffffef18);
          key_13._M_string_length = uVar24;
          key_13._M_dataplus._M_p = (pointer)this;
          key_13.field_2._M_allocated_capacity = (size_type)tx;
          key_13.field_2._8_8_ = lVar28;
          val_16.val._M_dataplus._M_p._0_4_ = uVar21;
          val_16._0_8_ = txundo;
          val_16.val._M_dataplus._M_p._4_4_ = verbosity;
          val_16.val._M_string_length = (size_type)block_hash;
          val_16.val.field_2._M_allocated_capacity = uVar10;
          val_16.val.field_2._M_local_buf[8] = bVar7;
          val_16.val.field_2._9_7_ = in_stack_ffffffffffffef19;
          val_16.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
          val_16.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
          val_16.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
          val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
          val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
          val_16.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
          UniValue::pushKV(&p,key_13,val_16);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_9b8.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_9b8.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8.val._M_dataplus._M_p != &local_9b8.val.field_2) {
            operator_delete(local_9b8.val._M_dataplus._M_p,
                            local_9b8.val.field_2._M_allocated_capacity + 1);
          }
          if (local_960[0] != local_950) {
            operator_delete(local_960[0],local_950[0] + 1);
          }
          local_9d8[0] = local_9c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"height","");
          in_stack_ffffffffffffef18 = SUB41(*(uint *)&pCVar22->field_0x28 >> 1,0);
          in_stack_ffffffffffffef19 = (uint7)(uint3)(*(uint *)&pCVar22->field_0x28 >> 9);
          UniValue::UniValue<unsigned_long,_unsigned_long,_true>
                    (&local_a30,(unsigned_long *)&stack0xffffffffffffef18);
          key_14._M_string_length = uVar24;
          key_14._M_dataplus._M_p = (pointer)this;
          key_14.field_2._M_allocated_capacity = (size_type)tx;
          key_14.field_2._8_8_ = lVar28;
          val_17.val._M_dataplus._M_p._0_4_ = uVar21;
          val_17._0_8_ = txundo;
          val_17.val._M_dataplus._M_p._4_4_ = verbosity;
          val_17.val._M_string_length = (size_type)block_hash;
          val_17.val.field_2._M_allocated_capacity = uVar10;
          val_17.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
          val_17.val.field_2._9_7_ = in_stack_ffffffffffffef19;
          val_17.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
          val_17.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
          val_17.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
          val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
          val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
          val_17.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
          UniValue::pushKV(&p,key_14,val_17);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_a30.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a30.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a30.val._M_dataplus._M_p != &local_a30.val.field_2) {
            operator_delete(local_a30.val._M_dataplus._M_p,
                            local_a30.val.field_2._M_allocated_capacity + 1);
          }
          if (local_9d8[0] != local_9c8) {
            operator_delete(local_9d8[0],local_9c8[0] + 1);
          }
          local_a50[0] = local_a40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"value","");
          ValueFromAmount(&local_aa8,(pCVar22->out).nValue);
          key_15._M_string_length = uVar24;
          key_15._M_dataplus._M_p = (pointer)this;
          key_15.field_2._M_allocated_capacity = (size_type)tx;
          key_15.field_2._8_8_ = lVar28;
          val_18.val._M_dataplus._M_p._0_4_ = uVar21;
          val_18._0_8_ = txundo;
          val_18.val._M_dataplus._M_p._4_4_ = verbosity;
          val_18.val._M_string_length = (size_type)block_hash;
          val_18.val.field_2._M_allocated_capacity = uVar10;
          val_18.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
          val_18.val.field_2._9_7_ = in_stack_ffffffffffffef19;
          val_18.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
          val_18.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
          val_18.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
          val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
          val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
          val_18.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
          UniValue::pushKV(&p,key_15,val_18);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_aa8.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_aa8.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_aa8.val._M_dataplus._M_p != &local_aa8.val.field_2) {
            operator_delete(local_aa8.val._M_dataplus._M_p,
                            local_aa8.val.field_2._M_allocated_capacity + 1);
          }
          if (local_a50[0] != local_a40) {
            operator_delete(local_a50[0],local_a40[0] + 1);
          }
          local_ac8[0] = local_ab8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"scriptPubKey","");
          local_b20 = o.typ;
          local_b18 = &local_b08;
          paVar23 = &o.val.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)o.val._M_dataplus._M_p == paVar23) {
            uStack_b00 = o.val.field_2._8_8_;
          }
          else {
            local_b18 = (size_type *)o.val._M_dataplus._M_p;
          }
          local_b08 = o.val.field_2._M_allocated_capacity;
          local_b10 = o.val._M_string_length;
          o.val._M_string_length = 0;
          o.val.field_2._M_allocated_capacity =
               o.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_af8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               o.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_af8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               o.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_af8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               o.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          o.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_ae0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_ae0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish =
               o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_ae0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          key_16._M_string_length = uVar24;
          key_16._M_dataplus._M_p = (pointer)this;
          key_16.field_2._M_allocated_capacity = (size_type)tx;
          key_16.field_2._8_8_ = lVar28;
          val_19.val._M_dataplus._M_p._0_4_ = uVar21;
          val_19._0_8_ = txundo;
          val_19.val._M_dataplus._M_p._4_4_ = verbosity;
          val_19.val._M_string_length = (size_type)block_hash;
          val_19.val.field_2._M_allocated_capacity = uVar10;
          val_19.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
          val_19.val.field_2._9_7_ = in_stack_ffffffffffffef19;
          val_19.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
          val_19.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
          val_19.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
          val_19.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
          val_19.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
          val_19.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
          o.val._M_dataplus._M_p = (pointer)paVar23;
          UniValue::pushKV(&p,key_16,val_19);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_ae0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_af8);
          if (local_b18 != &local_b08) {
            operator_delete(local_b18,local_b08 + 1);
          }
          if (local_ac8[0] != local_ab8) {
            operator_delete(local_ac8[0],local_ab8[0] + 1);
          }
          local_b40[0] = local_b30;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b40,"prevout","");
          local_b98 = p.typ;
          local_b90 = &local_b80;
          paVar23 = &p.val.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p.val._M_dataplus._M_p == paVar23) {
            uStack_b78 = p.val.field_2._8_8_;
          }
          else {
            local_b90 = (size_type *)p.val._M_dataplus._M_p;
          }
          local_b80 = p.val.field_2._M_allocated_capacity;
          local_b88 = p.val._M_string_length;
          p.val._M_string_length = 0;
          p.val.field_2._M_allocated_capacity =
               p.val.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_b70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               p.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_b70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               p.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b70.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               p.keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          p.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b58.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_b58.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish =
               p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_b58.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          key_17._M_string_length = uVar24;
          key_17._M_dataplus._M_p = (pointer)this;
          key_17.field_2._M_allocated_capacity = (size_type)tx;
          key_17.field_2._8_8_ = lVar28;
          val_20.val._M_dataplus._M_p._0_4_ = uVar21;
          val_20._0_8_ = txundo;
          val_20.val._M_dataplus._M_p._4_4_ = verbosity;
          val_20.val._M_string_length = (size_type)block_hash;
          val_20.val.field_2._M_allocated_capacity = uVar10;
          val_20.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
          val_20.val.field_2._9_7_ = in_stack_ffffffffffffef19;
          val_20.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
          val_20.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
          val_20.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
          val_20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
          val_20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
          val_20.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
          p.val._M_dataplus._M_p = (pointer)paVar23;
          UniValue::pushKV(&vout,key_17,val_20);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b70);
          if (local_b90 != &local_b80) {
            operator_delete(local_b90,local_b80 + 1);
          }
          if (local_b40[0] != local_b30) {
            operator_delete(local_b40[0],local_b30[0] + 1);
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&p.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&p.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p.val._M_dataplus._M_p != &p.val.field_2) {
            operator_delete(p.val._M_dataplus._M_p,p.val.field_2._M_allocated_capacity + 1);
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&o.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&o.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)o.val._M_dataplus._M_p != &o.val.field_2) {
            operator_delete(o.val._M_dataplus._M_p,o.val.field_2._M_allocated_capacity + 1);
          }
        }
      }
      paVar23 = &vout.val.field_2;
      local_bb8[0] = local_ba8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_bb8,"sequence","");
      o._0_8_ = ZEXT48(pCVar15->nSequence);
      UniValue::UniValue<long,_long,_true>(&local_c10,(long *)&o);
      key_18._M_string_length = uVar24;
      key_18._M_dataplus._M_p = (pointer)this;
      key_18.field_2._M_allocated_capacity = (size_type)tx;
      key_18.field_2._8_8_ = lVar28;
      val_21.val._M_dataplus._M_p._0_4_ = uVar21;
      val_21._0_8_ = txundo;
      val_21.val._M_dataplus._M_p._4_4_ = verbosity;
      val_21.val._M_string_length = (size_type)block_hash;
      val_21.val.field_2._M_allocated_capacity = uVar10;
      val_21.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
      val_21.val.field_2._9_7_ = in_stack_ffffffffffffef19;
      val_21.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
      val_21.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
      val_21.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
      val_21.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
      val_21.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
      val_21.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
      UniValue::pushKV(&vout,key_18,val_21);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c10.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c10.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c10.val._M_dataplus._M_p != &local_c10.val.field_2) {
        operator_delete(local_c10.val._M_dataplus._M_p,
                        local_c10.val.field_2._M_allocated_capacity + 1);
      }
      if (local_bb8[0] != local_ba8) {
        operator_delete(local_bb8[0],local_ba8[0] + 1);
      }
      local_c68 = vout.typ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vout.val._M_dataplus._M_p == paVar23) {
        local_c50._8_8_ =
             CONCAT17(vout.val.field_2._M_local_buf[0xf],
                      CONCAT25(vout.val.field_2._13_2_,
                               CONCAT41(vout.val.field_2._9_4_,vout.val.field_2._M_local_buf[8])));
        local_c60 = &local_c50;
      }
      else {
        local_c60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)vout.val._M_dataplus._M_p;
      }
      local_c50._M_allocated_capacity._1_7_ = vout.val.field_2._M_allocated_capacity._1_7_;
      local_c50._M_local_buf[0] = vout.val.field_2._M_local_buf[0];
      local_c58 = vout.val._M_string_length;
      vout.val._M_string_length = 0;
      vout.val.field_2._M_local_buf[0] = '\0';
      local_c40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vout.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vout.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c40.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vout.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vout.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c28.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c28.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c28.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      val_00.val._M_dataplus._M_p = (pointer)uVar24;
      val_00._0_8_ = this;
      val_00.val._M_string_length = (size_type)tx;
      val_00.val.field_2._M_allocated_capacity = lVar28;
      val_00.val.field_2._8_8_ = txundo;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar21;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = verbosity;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)block_hash;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar10;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffef18;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffef19;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef20;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef28._M_p;
      vout.val._M_dataplus._M_p = (pointer)paVar23;
      UniValue::push_back(&vin,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c40);
      if (local_c60 != &local_c50) {
        operator_delete(local_c60,local_c50._M_allocated_capacity + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vout.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vout.keys);
      in_stack_ffffffffffffef10 = uVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vout.val._M_dataplus._M_p != paVar23) {
        operator_delete(vout.val._M_dataplus._M_p,
                        CONCAT71(vout.val.field_2._M_allocated_capacity._1_7_,
                                 vout.val.field_2._M_local_buf[0]) + 1);
      }
      in_stack_ffffffffffffeee0 = (ulong)((int)uVar10 + 1);
      pCVar15 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar15 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (in_stack_ffffffffffffeee0 <= uVar10 && uVar10 - in_stack_ffffffffffffeee0 != 0);
  }
  tx_00 = tx;
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"vin","");
  local_ce0 = vin.typ;
  paVar23 = &vin.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vin.val._M_dataplus._M_p == paVar23) {
    local_cc8._8_8_ =
         CONCAT17(vin.val.field_2._M_local_buf[0xf],
                  CONCAT25(vin.val.field_2._13_2_,
                           CONCAT41(vin.val.field_2._9_4_,vin.val.field_2._M_local_buf[8])));
    local_cd8 = &local_cc8;
  }
  else {
    local_cd8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vin.val._M_dataplus._M_p;
  }
  local_cc8._M_allocated_capacity._1_7_ = vin.val.field_2._M_allocated_capacity._1_7_;
  local_cc8._M_local_buf[0] = vin.val.field_2._M_local_buf[0];
  local_cd0 = vin.val._M_string_length;
  vin.val._M_string_length = 0;
  vin.val.field_2._M_local_buf[0] = '\0';
  local_cb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       vin.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_cb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       vin.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_cb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       vin.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ca0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_ca0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_ca0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  vin.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  key_19._M_string_length = in_stack_ffffffffffffeee0;
  key_19._M_dataplus._M_p = (pointer)this;
  key_19.field_2._M_allocated_capacity = (size_type)tx_00;
  key_19.field_2._8_8_ = lVar28;
  val_22.val._M_dataplus._M_p._0_4_ = uVar21;
  val_22._0_8_ = txundo;
  val_22.val._M_dataplus._M_p._4_4_ = verbosity;
  val_22.val._M_string_length = (size_type)block_hash;
  val_22.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_22.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_22.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_22.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_22.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_22.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_22.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_22.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_22.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  vin.val._M_dataplus._M_p = (pointer)paVar23;
  UniValue::pushKV(this,key_19,val_22);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_ca0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_cb8);
  if (local_cd8 != &local_cc8) {
    operator_delete(local_cd8,local_cc8._M_allocated_capacity + 1);
  }
  if (local_c88[0] != local_c78) {
    operator_delete(local_c88[0],local_c78[0] + 1);
  }
  local_d00 = local_cf0;
  uVar10 = 0;
  local_cf8 = 0;
  vout.val._M_dataplus._M_p = (pointer)&vout.val.field_2;
  vout.typ = VARR;
  vout.val.field_2._M_local_buf[0] = '\0';
  vout.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_cf0._1_8_;
  vout.val.field_2._M_local_buf[8] = SUB81(local_cf0._1_8_,7);
  vout.val.field_2._9_4_ = local_ce7;
  vout.val.field_2._13_2_ = local_ce3;
  vout.val.field_2._M_local_buf[0xf] = local_ce1;
  vout.val._M_string_length = 0;
  local_cf0[0] = 0;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar20 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish != pCVar20) {
    paVar23 = &o.val.field_2;
    uVar16 = 1;
    uVar24 = 0;
    uVar10 = 0;
    do {
      local_d20 = &local_d10;
      o.typ = VOBJ;
      o.val.field_2._M_allocated_capacity = (ulong)uStack_d0f << 8;
      o.val.field_2._8_8_ = uStack_d08;
      o.val._M_string_length = 0;
      local_d18 = 0;
      local_d10 = 0;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d40[0] = local_d30;
      o.val._M_dataplus._M_p = (pointer)paVar23;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,"value","");
      pCVar20 = pCVar20 + uVar24;
      ValueFromAmount(&local_d98,pCVar20->nValue);
      key_20._M_string_length = uVar10;
      key_20._M_dataplus._M_p = (pointer)this;
      key_20.field_2._M_allocated_capacity = (size_type)tx_00;
      key_20.field_2._8_8_ = lVar28;
      val_23.val._M_dataplus._M_p._0_4_ = uVar21;
      val_23._0_8_ = txundo;
      val_23.val._M_dataplus._M_p._4_4_ = verbosity;
      val_23.val._M_string_length = (size_type)block_hash;
      val_23.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
      val_23.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
      val_23.val.field_2._9_7_ = in_stack_ffffffffffffef19;
      val_23.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
      val_23.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
      val_23.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
      val_23.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
      val_23.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
      val_23.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
      UniValue::pushKV(&o,key_20,val_23);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d98.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d98.keys);
      in_stack_ffffffffffffeee0 = uVar10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d98.val._M_dataplus._M_p != &local_d98.val.field_2) {
        operator_delete(local_d98.val._M_dataplus._M_p,
                        local_d98.val.field_2._M_allocated_capacity + 1);
        in_stack_ffffffffffffeee0 = uVar10;
      }
      if (local_d40[0] != local_d30) {
        operator_delete(local_d40[0],local_d30[0] + 1);
      }
      local_db8[0] = local_da8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_db8,"n","");
      p._0_8_ = uVar24;
      UniValue::UniValue<long,_long,_true>(&local_e10,(long *)&p);
      key_21._M_string_length = in_stack_ffffffffffffeee0;
      key_21._M_dataplus._M_p = (pointer)this;
      key_21.field_2._M_allocated_capacity = (size_type)tx_00;
      key_21.field_2._8_8_ = lVar28;
      val_24.val._M_dataplus._M_p._0_4_ = uVar21;
      val_24._0_8_ = txundo;
      val_24.val._M_dataplus._M_p._4_4_ = verbosity;
      val_24.val._M_string_length = (size_type)block_hash;
      val_24.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
      val_24.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
      val_24.val.field_2._9_7_ = in_stack_ffffffffffffef19;
      val_24.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
      val_24.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
      val_24.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
      val_24.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
      val_24.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
      val_24.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
      UniValue::pushKV(&o,key_21,val_24);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_e10.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e10.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10.val._M_dataplus._M_p != &local_e10.val.field_2) {
        operator_delete(local_e10.val._M_dataplus._M_p,
                        local_e10.val.field_2._M_allocated_capacity + 1);
      }
      if (local_db8[0] != local_da8) {
        operator_delete(local_db8[0],local_da8[0] + 1);
      }
      local_e30 = &local_e20;
      p.typ = VOBJ;
      p.val._M_dataplus._M_p = (pointer)&p.val.field_2;
      p.val.field_2._M_allocated_capacity = (ulong)uStack_e1f << 8;
      p.val.field_2._8_8_ = uStack_e18;
      p.val._M_string_length = 0;
      local_e28 = 0;
      local_e20 = 0;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ScriptToUniv(&pCVar20->scriptPubKey,&p,true,true,(SigningProvider *)0x0);
      local_e50[0] = local_e40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e50,"scriptPubKey","");
      local_ea8 = p.typ;
      local_ea0 = &local_e90;
      paVar2 = &p.val.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p.val._M_dataplus._M_p == paVar2) {
        uStack_e88 = p.val.field_2._8_8_;
      }
      else {
        local_ea0 = (size_type *)p.val._M_dataplus._M_p;
      }
      local_e90 = p.val.field_2._M_allocated_capacity;
      local_e98 = p.val._M_string_length;
      p.val._M_string_length = 0;
      p.val.field_2._M_allocated_capacity = p.val.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      local_e80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           p.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_e80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           p.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_e80.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           p.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      p.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e68.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_e68.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_e68.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key_22._M_string_length = in_stack_ffffffffffffeee0;
      key_22._M_dataplus._M_p = (pointer)this;
      key_22.field_2._M_allocated_capacity = (size_type)tx_00;
      key_22.field_2._8_8_ = lVar28;
      val_25.val._M_dataplus._M_p._0_4_ = uVar21;
      val_25._0_8_ = txundo;
      val_25.val._M_dataplus._M_p._4_4_ = verbosity;
      val_25.val._M_string_length = (size_type)block_hash;
      val_25.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
      val_25.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
      val_25.val.field_2._9_7_ = in_stack_ffffffffffffef19;
      val_25.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
      val_25.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
      val_25.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
      val_25.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
      val_25.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
      val_25.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
      p.val._M_dataplus._M_p = (pointer)paVar2;
      UniValue::pushKV(&o,key_22,val_25);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_e68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e80);
      if (local_ea0 != &local_e90) {
        operator_delete(local_ea0,local_e90 + 1);
      }
      if (local_e50[0] != local_e40) {
        operator_delete(local_e50[0],local_e40[0] + 1);
      }
      local_f00 = o.typ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)o.val._M_dataplus._M_p == paVar23) {
        uStack_ee0 = o.val.field_2._8_8_;
        local_ef8 = &local_ee8;
      }
      else {
        local_ef8 = (size_type *)o.val._M_dataplus._M_p;
      }
      local_ee8 = o.val.field_2._M_allocated_capacity;
      local_ef0 = o.val._M_string_length;
      o.val._M_string_length = 0;
      o.val.field_2._M_allocated_capacity = o.val.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      local_ed8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           o.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_ed8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           o.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_ed8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           o.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      o.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_ec0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_ec0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_ec0.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      o.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      val_01.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeee0;
      val_01._0_8_ = this;
      val_01.val._M_string_length = (size_type)tx_00;
      val_01.val.field_2._M_allocated_capacity = lVar28;
      val_01.val.field_2._8_8_ = txundo;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar21;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = verbosity;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)block_hash;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef10;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = in_stack_ffffffffffffef18;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ = in_stack_ffffffffffffef19;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef20;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef28._M_p;
      o.val._M_dataplus._M_p = (pointer)paVar23;
      UniValue::push_back(&vout,val_01);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_ec0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_ed8);
      if (local_ef8 != &local_ee8) {
        operator_delete(local_ef8,local_ee8 + 1);
      }
      pCVar25 = txundo;
      if (txundo != (CTxUndo *)0x0) {
        pCVar25 = (CTxUndo *)pCVar20->nValue;
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&p.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&p.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p.val._M_dataplus._M_p != &p.val.field_2) {
        operator_delete(p.val._M_dataplus._M_p,p.val.field_2._M_allocated_capacity + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&o.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&o.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)o.val._M_dataplus._M_p != paVar23) {
        operator_delete(o.val._M_dataplus._M_p,o.val.field_2._M_allocated_capacity + 1);
      }
      uVar10 = (long)&(pCVar25->vprevout).super__Vector_base<Coin,_std::allocator<Coin>_>._M_impl.
                      super__Vector_impl_data._M_start + in_stack_ffffffffffffeee0;
      uVar24 = (ulong)uVar16;
      pCVar20 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = ((long)(tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar20 >> 3) * -0x3333333333333333;
      uVar16 = uVar16 + 1;
    } while (uVar24 <= uVar11 && uVar11 - uVar24 != 0);
  }
  local_f20[0] = local_f10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f20,"vout","");
  local_f78 = vout.typ;
  paVar23 = &vout.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vout.val._M_dataplus._M_p == paVar23) {
    local_f60._8_8_ =
         CONCAT17(vout.val.field_2._M_local_buf[0xf],
                  CONCAT25(vout.val.field_2._13_2_,
                           CONCAT41(vout.val.field_2._9_4_,vout.val.field_2._M_local_buf[8])));
    local_f70 = &local_f60;
  }
  else {
    local_f70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vout.val._M_dataplus._M_p;
  }
  local_f60._M_allocated_capacity._1_7_ = vout.val.field_2._M_allocated_capacity._1_7_;
  local_f60._M_local_buf[0] = vout.val.field_2._M_local_buf[0];
  local_f68 = vout.val._M_string_length;
  vout.val._M_string_length = 0;
  vout.val.field_2._M_local_buf[0] = '\0';
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       vout.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       vout.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       vout.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vout.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f38.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f38.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_f38.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vout.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_23._M_string_length = in_stack_ffffffffffffeee0;
  key_23._M_dataplus._M_p = (pointer)this;
  key_23.field_2._M_allocated_capacity = (size_type)tx_00;
  key_23.field_2._8_8_ = lVar28;
  val_26.val._M_dataplus._M_p._0_4_ = uVar21;
  val_26._0_8_ = txundo;
  val_26.val._M_dataplus._M_p._4_4_ = verbosity;
  val_26.val._M_string_length = (size_type)block_hash;
  val_26.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
  val_26.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
  val_26.val.field_2._9_7_ = in_stack_ffffffffffffef19;
  val_26.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
  val_26.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
  val_26.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
  val_26.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
  val_26.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
  val_26.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
  vout.val._M_dataplus._M_p = (pointer)paVar23;
  UniValue::pushKV(this,key_23,val_26);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_f38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f50);
  if (local_f70 != &local_f60) {
    operator_delete(local_f70,local_f60._M_allocated_capacity + 1);
  }
  pCVar27 = tx_00;
  lVar29 = lVar28;
  puVar30 = block_hash;
  if (local_f20[0] != local_f10) {
    operator_delete(local_f20[0],local_f10[0] + 1);
  }
  pUVar26 = this;
  if (txundo != (CTxUndo *)0x0) {
    o.typ._0_1_ = lVar28 - uVar10 < 0x775f05a074001;
    inline_check_non_fatal<bool>
              ((bool *)&o,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/core_write.cpp"
               ,0x100,"TxToUniv","MoneyRange(fee)");
    local_f98[0] = local_f88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f98,"fee","");
    ValueFromAmount(&local_ff0,lVar28 - uVar10);
    key_24._M_string_length = in_stack_ffffffffffffeee0;
    key_24._M_dataplus._M_p = (pointer)pUVar26;
    key_24.field_2._M_allocated_capacity = (size_type)pCVar27;
    key_24.field_2._8_8_ = lVar29;
    val_27.val._M_dataplus._M_p._0_4_ = uVar21;
    val_27._0_8_ = txundo;
    val_27.val._M_dataplus._M_p._4_4_ = verbosity;
    val_27.val._M_string_length = (size_type)puVar30;
    val_27.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
    val_27.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
    val_27.val.field_2._9_7_ = in_stack_ffffffffffffef19;
    val_27.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
    val_27.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
    val_27.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
    val_27.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
    val_27.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
    val_27.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
    UniValue::pushKV(this,key_24,val_27);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_ff0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ff0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ff0.val._M_dataplus._M_p != &local_ff0.val.field_2) {
      operator_delete(local_ff0.val._M_dataplus._M_p,local_ff0.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_f98[0] != local_f88) {
      operator_delete(local_f98[0],local_f88[0] + 1);
    }
  }
  puVar12 = (uint256 *)
            std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (block_hash,block_hash + 1);
  if (puVar12 != block_hash + 1) {
    local_1010[0] = local_1000;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"blockhash","");
    base_blob<256u>::GetHex_abi_cxx11_((string *)&o,block_hash);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1068,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
    key_25._M_string_length = in_stack_ffffffffffffeee0;
    key_25._M_dataplus._M_p = (pointer)pUVar26;
    key_25.field_2._M_allocated_capacity = (size_type)pCVar27;
    key_25.field_2._8_8_ = lVar29;
    val_28.val._M_dataplus._M_p._0_4_ = uVar21;
    val_28._0_8_ = txundo;
    val_28.val._M_dataplus._M_p._4_4_ = verbosity;
    val_28.val._M_string_length = (size_type)puVar30;
    val_28.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
    val_28.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
    val_28.val.field_2._9_7_ = in_stack_ffffffffffffef19;
    val_28.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
    val_28.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
    val_28.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
    val_28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
    val_28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
    val_28.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
    UniValue::pushKV(this,key_25,val_28);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1068.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1068.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068.val._M_dataplus._M_p != &local_1068.val.field_2) {
      operator_delete(local_1068.val._M_dataplus._M_p,
                      local_1068.val.field_2._M_allocated_capacity + 1);
    }
    if ((size_type *)o._0_8_ != &o.val._M_string_length) {
      operator_delete((void *)o._0_8_,o.val._M_string_length + 1);
    }
    if (local_1010[0] != local_1000) {
      operator_delete(local_1010[0],local_1000[0] + 1);
    }
  }
  if ((char)uVar21 != '\0') {
    local_1088[0] = (pointer)local_1078;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1088,"hex","");
    EncodeHexTx_abi_cxx11_((string *)&o,tx_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&stack0xffffffffffffef20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&o);
    key_26._M_string_length = in_stack_ffffffffffffeee0;
    key_26._M_dataplus._M_p = (pointer)pUVar26;
    key_26.field_2._M_allocated_capacity = (size_type)pCVar27;
    key_26.field_2._8_8_ = lVar29;
    val_29.val._M_dataplus._M_p._0_4_ = uVar21;
    val_29._0_8_ = txundo;
    val_29.val._M_dataplus._M_p._4_4_ = verbosity;
    val_29.val._M_string_length = (size_type)puVar30;
    val_29.val.field_2._M_allocated_capacity = in_stack_ffffffffffffef10;
    val_29.val.field_2._M_local_buf[8] = in_stack_ffffffffffffef18;
    val_29.val.field_2._9_7_ = in_stack_ffffffffffffef19;
    val_29.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef20;
    val_29.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef28._M_p;
    val_29.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef30;
    val_29.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffef38;
    val_29.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffef40._0_8_;
    val_29.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffef40._8_8_;
    UniValue::pushKV(this,key_26,val_29);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_10a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffef48);
    if ((pointer)in_stack_ffffffffffffef28._M_p != (pointer)&stack0xffffffffffffef38) {
      operator_delete(in_stack_ffffffffffffef28._M_p,in_stack_ffffffffffffef38 + 1);
    }
    if ((size_type *)o._0_8_ != &o.val._M_string_length) {
      operator_delete((void *)o._0_8_,o.val._M_string_length + 1);
    }
    if (local_1088[0] != (pointer)local_1078) {
      operator_delete(local_1088[0],(ulong)((long)&local_1078[0]->typ + 1));
    }
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vout.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vout.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vout.val._M_dataplus._M_p != &vout.val.field_2) {
    operator_delete(vout.val._M_dataplus._M_p,
                    CONCAT71(vout.val.field_2._M_allocated_capacity._1_7_,
                             vout.val.field_2._M_local_buf[0]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vin.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vin.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vin.val._M_dataplus._M_p != &vin.val.field_2) {
    operator_delete(vin.val._M_dataplus._M_p,
                    CONCAT71(vin.val.field_2._M_allocated_capacity._1_7_,
                             vin.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxToUniv(const CTransaction& tx, const uint256& block_hash, UniValue& entry, bool include_hex, const CTxUndo* txundo, TxVerbosity verbosity)
{
    CHECK_NONFATAL(verbosity >= TxVerbosity::SHOW_DETAILS);

    entry.pushKV("txid", tx.GetHash().GetHex());
    entry.pushKV("hash", tx.GetWitnessHash().GetHex());
    entry.pushKV("version", tx.version);
    entry.pushKV("size", tx.GetTotalSize());
    entry.pushKV("vsize", (GetTransactionWeight(tx) + WITNESS_SCALE_FACTOR - 1) / WITNESS_SCALE_FACTOR);
    entry.pushKV("weight", GetTransactionWeight(tx));
    entry.pushKV("locktime", (int64_t)tx.nLockTime);

    UniValue vin{UniValue::VARR};

    // If available, use Undo data to calculate the fee. Note that txundo == nullptr
    // for coinbase transactions and for transactions where undo data is unavailable.
    const bool have_undo = txundo != nullptr;
    CAmount amt_total_in = 0;
    CAmount amt_total_out = 0;

    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        const CTxIn& txin = tx.vin[i];
        UniValue in(UniValue::VOBJ);
        if (tx.IsCoinBase()) {
            in.pushKV("coinbase", HexStr(txin.scriptSig));
        } else {
            in.pushKV("txid", txin.prevout.hash.GetHex());
            in.pushKV("vout", (int64_t)txin.prevout.n);
            UniValue o(UniValue::VOBJ);
            o.pushKV("asm", ScriptToAsmStr(txin.scriptSig, true));
            o.pushKV("hex", HexStr(txin.scriptSig));
            in.pushKV("scriptSig", std::move(o));
        }
        if (!tx.vin[i].scriptWitness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : tx.vin[i].scriptWitness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("txinwitness", std::move(txinwitness));
        }
        if (have_undo) {
            const Coin& prev_coin = txundo->vprevout[i];
            const CTxOut& prev_txout = prev_coin.out;

            amt_total_in += prev_txout.nValue;

            if (verbosity == TxVerbosity::SHOW_DETAILS_AND_PREVOUT) {
                UniValue o_script_pub_key(UniValue::VOBJ);
                ScriptToUniv(prev_txout.scriptPubKey, /*out=*/o_script_pub_key, /*include_hex=*/true, /*include_address=*/true);

                UniValue p(UniValue::VOBJ);
                p.pushKV("generated", bool(prev_coin.fCoinBase));
                p.pushKV("height", uint64_t(prev_coin.nHeight));
                p.pushKV("value", ValueFromAmount(prev_txout.nValue));
                p.pushKV("scriptPubKey", std::move(o_script_pub_key));
                in.pushKV("prevout", std::move(p));
            }
        }
        in.pushKV("sequence", (int64_t)txin.nSequence);
        vin.push_back(std::move(in));
    }
    entry.pushKV("vin", std::move(vin));

    UniValue vout(UniValue::VARR);
    for (unsigned int i = 0; i < tx.vout.size(); i++) {
        const CTxOut& txout = tx.vout[i];

        UniValue out(UniValue::VOBJ);

        out.pushKV("value", ValueFromAmount(txout.nValue));
        out.pushKV("n", (int64_t)i);

        UniValue o(UniValue::VOBJ);
        ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);
        out.pushKV("scriptPubKey", std::move(o));
        vout.push_back(std::move(out));

        if (have_undo) {
            amt_total_out += txout.nValue;
        }
    }
    entry.pushKV("vout", std::move(vout));

    if (have_undo) {
        const CAmount fee = amt_total_in - amt_total_out;
        CHECK_NONFATAL(MoneyRange(fee));
        entry.pushKV("fee", ValueFromAmount(fee));
    }

    if (!block_hash.IsNull()) {
        entry.pushKV("blockhash", block_hash.GetHex());
    }

    if (include_hex) {
        entry.pushKV("hex", EncodeHexTx(tx)); // The hex-encoded transaction. Used the name "hex" to be consistent with the verbose output of "getrawtransaction".
    }
}